

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringConverter.cpp
# Opt level: O1

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::StringConverter,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::StringConverter>_>_>
* __thiscall
cali::StringConverter::rec_dict_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::StringConverter,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::StringConverter>_>_>
           *__return_storage_ptr__,StringConverter *this,bool *okptr)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 uVar3;
  string *this_00;
  bool bVar4;
  char *separators;
  int iVar5;
  string val;
  string key;
  istringstream is;
  string local_220;
  undefined1 *local_200;
  char *local_1f8;
  undefined1 local_1f0;
  undefined7 uStack_1ef;
  undefined8 local_1e0;
  ulong local_1d8;
  string local_1d0;
  long local_1b0 [4];
  int aiStack_190 [22];
  ios_base local_138 [264];
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  separators = (char *)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,(string *)this,_S_in);
  cVar2 = util::read_char((istream *)local_1b0);
  if (cVar2 == '{') {
    local_1d8 = 0;
    local_1e0 = 0;
LAB_0019124e:
    util::read_word_abi_cxx11_(&local_1d0,(util *)local_1b0,(istream *)0x228775,separators);
    cVar2 = util::read_char((istream *)local_1b0);
    if (cVar2 == ':') {
      local_200 = &local_1f0;
      local_1f8 = (char *)0x0;
      local_1f0 = 0;
      cVar2 = util::read_char((istream *)local_1b0);
      if (cVar2 == '[') {
        cVar2 = '\x01';
        std::__cxx11::string::_M_replace((ulong)&local_200,0,local_1f8,0x228869);
        separators = (char *)0x5d;
        util::read_nested_text_abi_cxx11_(&local_220,(util *)local_1b0,(istream *)0x5b,']',cVar2);
        std::__cxx11::string::_M_append((char *)&local_200,(ulong)local_220._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        cVar2 = util::read_char((istream *)local_1b0);
        uVar3 = extraout_var_01;
        if (cVar2 == ']') goto LAB_00191322;
LAB_001913cc:
        cVar2 = '\0';
        iVar5 = 2;
        local_1e0 = CONCAT71(uVar3,1);
      }
      else {
        if (cVar2 == '{') {
          cVar2 = '\x01';
          std::__cxx11::string::_M_replace((ulong)&local_200,0,local_1f8,0x2287a7);
          separators = (char *)0x7d;
          util::read_nested_text_abi_cxx11_(&local_220,(util *)local_1b0,(istream *)0x7b,'}',cVar2);
          std::__cxx11::string::_M_append((char *)&local_200,(ulong)local_220._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._M_dataplus._M_p != &local_220.field_2) {
            operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
          }
          cVar2 = util::read_char((istream *)local_1b0);
          uVar3 = extraout_var_00;
          if (cVar2 != '}') goto LAB_001913cc;
LAB_00191322:
          std::__cxx11::string::append((char *)&local_200);
        }
        else {
          std::istream::unget();
          util::read_word_abi_cxx11_(&local_220,(util *)local_1b0,(istream *)",}",separators);
          std::__cxx11::string::operator=((string *)&local_200,(string *)&local_220);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._M_dataplus._M_p != &local_220.field_2) {
            operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
          }
        }
        if (local_1d0._M_string_length != 0) {
          local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_220,local_200,local_1f8 + (long)local_200);
          this_00 = (string *)
                    std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::StringConverter,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::StringConverter>_>_>
                    ::operator[](__return_storage_ptr__,&local_1d0);
          std::__cxx11::string::operator=(this_00,(string *)&local_220);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._M_dataplus._M_p != &local_220.field_2) {
            operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
          }
        }
        cVar2 = util::read_char((istream *)local_1b0);
        iVar5 = 0;
      }
      if (local_200 != &local_1f0) {
        operator_delete(local_200,CONCAT71(uStack_1ef,local_1f0) + 1);
      }
    }
    else {
      iVar5 = 1;
      local_1d8 = CONCAT71(extraout_var,1);
      if (okptr != (bool *)0x0) {
        *okptr = false;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    if (iVar5 == 0) {
      if ((cVar2 != ',') || (*(int *)((long)aiStack_190 + *(long *)(local_1b0[0] + -0x18)) != 0))
      goto LAB_00191501;
      goto LAB_0019124e;
    }
    if (iVar5 != 2) {
      std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
      std::ios_base::~ios_base(local_138);
      if ((local_1d8 & 1) != 0) {
        return __return_storage_ptr__;
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::StringConverter>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::StringConverter>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::StringConverter>_>_>
      ::~_Rb_tree(&__return_storage_ptr__->_M_t);
      return __return_storage_ptr__;
    }
LAB_00191501:
    if (okptr == (bool *)0x0) goto LAB_00191519;
    bVar4 = (bool)(~(byte)local_1e0 & cVar2 == '}');
  }
  else {
    std::istream::unget();
    if (okptr == (bool *)0x0) goto LAB_00191519;
    bVar4 = false;
  }
  *okptr = bVar4;
LAB_00191519:
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, cali::StringConverter> cali::StringConverter::rec_dict(bool* okptr) const
{
    std::map<std::string, StringConverter> ret;
    bool                                   error = false;

    std::istringstream is(m_str);

    int  d = 0;
    char c = util::read_char(is);

    if (c == '{')
        ++d;
    else {
        is.unget();
        if (okptr)
            *okptr = false;
        return ret;
    }

    do {
        std::string key = util::read_word(is, ":");
        c               = util::read_char(is);

        if (c != ':') {
            if (okptr)
                *okptr = false;
            return ret;
        }

        std::string val;
        c = util::read_char(is);

        if (c == '{') {
            val = "{";
            val.append(util::read_nested_text(is, '{', '}'));

            c = util::read_char(is);
            if (c != '}') {
                error = true;
                break;
            }
            val.append("}");
        } else if (c == '[') {
            val = "[";
            val.append(util::read_nested_text(is, '[', ']'));

            c = util::read_char(is);
            if (c != ']') {
                error = true;
                break;
            }
            val.append("]");
        } else {
            is.unget();
            val = util::read_word(is, ",}");
        }

        if (!key.empty())
            ret[key] = StringConverter(val);

        c = util::read_char(is);
    } while (is.good() && c == ',');

    if (d > 0) {
        if (c != '}')
            error = true;
    } else
        is.unget();

    if (okptr)
        *okptr = !error;

    return ret;
}